

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_or_32_er_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint res;
  
  uVar1 = OPER_AY_AI_32();
  uVar2 = m68ki_cpu.ir >> 9 & 7;
  m68ki_cpu.not_z_flag = uVar1 | m68ki_cpu.dar[uVar2];
  m68ki_cpu.dar[uVar2] = m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_or_32_er_ai(void)
{
	uint res = DX |= OPER_AY_AI_32();

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}